

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void OpenSteer::drawCameraLookAt(Vec3 *cameraPosition,Vec3 *pointToLookAt,Vec3 *up_)

{
  Vec3 VVar1;
  Vec3 local_88;
  Vec3 local_78;
  Vec3 local_68;
  undefined4 local_5c;
  float local_58;
  float local_54;
  float local_50;
  undefined4 local_4c;
  float local_48;
  float local_44;
  float local_40;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined4 local_2c;
  
  local_68 = Vec3::operator-(pointToLookAt,cameraPosition);
  VVar1 = Vec3::perpendicularComponent(&local_68,up_);
  if ((VVar1.x == Vec3::zero.x) && (!NAN(VVar1.x) && !NAN(Vec3::zero.x))) {
    if ((VVar1.y == Vec3::zero.y) && (!NAN(VVar1.y) && !NAN(Vec3::zero.y))) {
      if ((VVar1.z == Vec3::zero.z) && (!NAN(VVar1.z) && !NAN(Vec3::zero.z))) {
        std::operator<<((ostream *)&std::cerr,"OpenSteer - LookAt: degenerate camera");
      }
    }
  }
  (*glad_glLoadIdentity)();
  local_78 = Vec3::operator-(pointToLookAt,cameraPosition);
  local_78 = Vec3::normalize(&local_78);
  local_88 = (Vec3)ZEXT812(0);
  Vec3::cross(&local_88,&local_78,up_);
  local_88 = Vec3::normalize(&local_88);
  local_48 = local_88.z;
  local_68.x = local_88.x;
  local_58 = local_88.y;
  local_54 = local_48 * local_78.x - local_78.z * local_68.x;
  local_44 = local_68.x * local_78.y - local_78.x * local_58;
  local_68.y = local_58 * local_78.z - local_78.y * local_48;
  local_68.z = -local_78.x;
  local_50 = -local_78.y;
  local_40 = -local_78.z;
  local_3c = 0;
  uStack_34 = 0;
  local_4c = 0;
  local_5c = 0;
  local_2c = 0x3f800000;
  (*glad_glLoadMatrixf)(&local_68.x);
  (*glad_glTranslatef)(-cameraPosition->x,-cameraPosition->y,-cameraPosition->z);
  return;
}

Assistant:

void 
OpenSteer::drawCameraLookAt (const Vec3& cameraPosition,
                             const Vec3& pointToLookAt,
                             const Vec3& up_)
{
    // check for valid "look at" parameters
    drawCameraLookAtCheck (cameraPosition, pointToLookAt, up_);

    glLoadIdentity();
    float matrix2[16];

    Vec3 forward = pointToLookAt - cameraPosition;
    forward = forward.normalize();
    Vec3 side;
    side.cross(forward, up_);
    side = side.normalize();
    Vec3 up;
    up.cross(side, forward);

    matrix2[0] = side.x;
    matrix2[4] = side.y;
    matrix2[8] = side.z;
    matrix2[12] = 0.f;
    matrix2[1] = up.x;
    matrix2[5] = up.y;
    matrix2[9] = up.z;
    matrix2[13] = 0.f;
    matrix2[2] = -forward.x;
    matrix2[6] = -forward.y;
    matrix2[10] = -forward.z;
    matrix2[14] = 0.f;
    matrix2[3] = matrix2[7] = matrix2[11] = 0.f;
    matrix2[15] = 1.f;

    glLoadMatrixf(matrix2);
    glTranslatef(-cameraPosition.x, -cameraPosition.y, -cameraPosition.z);
}